

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *this_00;
  pointer pMVar1;
  StringRef text;
  StringRef text_00;
  StringRef text_01;
  StringRef text_02;
  StringRef text_03;
  StringRef text_04;
  int iVar2;
  OfType OVar3;
  undefined4 uVar4;
  XmlFormatting fmt;
  undefined8 extraout_RDX;
  pointer pMVar5;
  StringRef name;
  StringRef name_00;
  allocator<char> local_99;
  string local_98;
  ScopedElement t;
  ScopedElement local_58 [2];
  _Alloc_hider local_38;
  
  iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  uVar4 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  if (((char)iVar2 == '\0') &&
     ((OVar3 = (assertionStats->assertionResult).m_resultData.resultType, (OVar3 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar3 == Warning) {
      uVar4 = 0;
      goto LAB_00134651;
    }
LAB_0013477a:
    if ((OVar3 != ExplicitSkip) && (OVar3 != Warning)) {
      return;
    }
  }
  else {
LAB_00134651:
    pMVar1 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_58[1]._8_8_ = &this->m_xml;
    local_58[1].m_writer._4_4_ = uVar4;
    local_38._M_p = (pointer)assertionStats;
    for (pMVar5 = (assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar1; pMVar5 = pMVar5 + 1) {
      fmt = (XmlFormatting)&local_98;
      if (pMVar5->type == Info && (char)uVar4 == '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Info",(allocator<char> *)local_58);
        XmlWriter::scopedElement((XmlWriter *)&t,(string *)local_58[1]._8_8_,fmt);
        std::__cxx11::string::~string((string *)&local_98);
        writeSourceInfo(this,&pMVar5->lineInfo);
        text.m_start = (pMVar5->message)._M_dataplus._M_p;
        text.m_size = (pMVar5->message)._M_string_length;
        XmlWriter::writeText(t.m_writer,text,Newline|Indent);
LAB_00134750:
        XmlWriter::ScopedElement::~ScopedElement(&t);
      }
      else if (pMVar5->type == Warning) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Warning",(allocator<char> *)local_58);
        XmlWriter::scopedElement((XmlWriter *)&t,(string *)local_58[1]._8_8_,fmt);
        std::__cxx11::string::~string((string *)&local_98);
        writeSourceInfo(this,&pMVar5->lineInfo);
        text_00.m_start = (pMVar5->message)._M_dataplus._M_p;
        text_00.m_size = (pMVar5->message)._M_string_length;
        XmlWriter::writeText(t.m_writer,text_00,Newline|Indent);
        goto LAB_00134750;
      }
    }
    assertionStats = (AssertionStats *)local_38._M_p;
    if (local_58[1].m_writer._4_1_ == '\0') {
      OVar3 = *(OfType *)(local_38._M_p + 0x88);
      goto LAB_0013477a;
    }
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Expression",(allocator<char> *)&t);
    this_00 = &this->m_xml;
    XmlWriter::startElement(this_00,&local_98,Newline|Indent);
    name.m_size = 7;
    name.m_start = "success";
    XmlWriter::writeAttribute
              (this_00,name,
               ((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    name_00.m_size = 4;
    name_00.m_start = "type";
    XmlWriter::writeAttribute(this_00,name_00,(assertionStats->assertionResult).m_info.macroName);
    std::__cxx11::string::~string((string *)&local_98);
    local_98._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
    local_98._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this,(SourceLineInfo *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Original",&local_99);
    XmlWriter::scopedElement((XmlWriter *)local_58,(string *)this_00,(XmlFormatting)&local_98);
    AssertionResult::getExpression_abi_cxx11_((string *)&t,&assertionStats->assertionResult);
    text_03.m_size = t._8_8_;
    text_03.m_start = &(t.m_writer)->m_tagIsOpen;
    XmlWriter::writeText(local_58[0].m_writer,text_03,Newline|Indent);
    std::__cxx11::string::~string((string *)&t);
    XmlWriter::ScopedElement::~ScopedElement(local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Expanded",&local_99);
    XmlWriter::scopedElement((XmlWriter *)local_58,(string *)this_00,(XmlFormatting)&local_98);
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)&t,&assertionStats->assertionResult)
    ;
    text_04.m_size = t._8_8_;
    text_04.m_start = &(t.m_writer)->m_tagIsOpen;
    XmlWriter::writeText(local_58[0].m_writer,text_04,Newline|Indent);
    std::__cxx11::string::~string((string *)&t);
    XmlWriter::ScopedElement::~ScopedElement(local_58);
    std::__cxx11::string::~string((string *)&local_98);
  }
  OVar3 = (assertionStats->assertionResult).m_resultData.resultType;
  if (OVar3 == Info) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Info",(allocator<char> *)local_58);
    XmlWriter::scopedElement((XmlWriter *)&t,(string *)&this->m_xml,(XmlFormatting)&local_98);
    text_02.m_start = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
    text_02.m_size = (assertionStats->assertionResult).m_resultData.message._M_string_length;
    XmlWriter::writeText(t.m_writer,text_02,Newline|Indent);
    XmlWriter::ScopedElement::~ScopedElement(&t);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    if (OVar3 == ExplicitSkip) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Skip",(allocator<char> *)&t);
      XmlWriter::startElement(&this->m_xml,&local_98,Newline|Indent);
    }
    else if (OVar3 == ExplicitFailure) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Failure",(allocator<char> *)&t);
      XmlWriter::startElement(&this->m_xml,&local_98,Newline|Indent);
    }
    else if (OVar3 == FatalErrorCondition) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"FatalErrorCondition",(allocator<char> *)&t);
      XmlWriter::startElement(&this->m_xml,&local_98,Newline|Indent);
    }
    else {
      if (OVar3 != ThrewException) goto LAB_00134a2c;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Exception",(allocator<char> *)&t);
      XmlWriter::startElement(&this->m_xml,&local_98,Newline|Indent);
    }
    std::__cxx11::string::~string((string *)&local_98);
    local_98._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
    local_98._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this,(SourceLineInfo *)&local_98);
    text_01.m_start = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
    text_01.m_size = (assertionStats->assertionResult).m_resultData.message._M_string_length;
    XmlWriter::writeText(&this->m_xml,text_01,Newline|Indent);
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
  }
LAB_00134a2c:
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
  }
  return;
}

Assistant:

void XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    auto t = m_xml.scopedElement( "Info" );
                    writeSourceInfo( msg.lineInfo );
                    t.writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    auto t = m_xml.scopedElement( "Warning" );
                    writeSourceInfo( msg.lineInfo );
                    t.writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if ( !includeResults && result.getResultType() != ResultWas::Warning &&
             result.getResultType() != ResultWas::ExplicitSkip ) {
            return;
        }

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success"_sr, result.succeeded() )
                .writeAttribute( "type"_sr, result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                     .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::ExplicitSkip:
                m_xml.startElement( "Skip" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();
    }